

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O1

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::gted
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          )

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  TreeIndexAPTED *pTVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  ulong uVar12;
  double dVar13;
  
  iVar4 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[t1_current_subtree];
  iVar10 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[t2_current_subtree];
  if (iVar10 == 1 || iVar4 == 1) {
    dVar13 = spf1(this,t1,t1_current_subtree,t2,t2_current_subtree);
    return dVar13;
  }
  pdVar5 = data_structures::Matrix<double>::read_at
                     (&this->delta_,(long)t1_current_subtree,(long)t2_current_subtree);
  iVar3 = (int)*pdVar5;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar7 = iVar2 + -1;
  uVar9 = (t1->super_Constants).tree_size_;
  if ((int)uVar9 < iVar2) {
    if (iVar3 < 0) {
      iVar4 = 0;
    }
    else {
      uVar8 = 0;
      if ((int)uVar9 < iVar3) {
        uVar8 = uVar9;
      }
      iVar4 = ((uVar8 - iVar3) + iVar10 + t2_current_subtree != 0) + 1;
    }
    iVar10 = iVar7 - uVar9;
    for (iVar3 = (t2->super_PreLToParent).prel_to_parent_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)(iVar7 - uVar9)]; t2_current_subtree <= iVar3;
        iVar3 = (t2->super_PreLToParent).prel_to_parent_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar3]) {
      pvVar1 = (t2->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&pvVar1[iVar3].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) -
                            *(long *)&pvVar1[iVar3].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl) >> 2);
      if (0 < (int)uVar8) {
        uVar12 = 0;
        do {
          iVar7 = *(int *)(*(long *)&pvVar1[iVar3].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + uVar12 * 4);
          if (iVar7 != iVar10) {
            gted(this,t1,t1_current_subtree,t2,iVar7);
          }
          uVar12 = uVar12 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar12);
      }
      iVar10 = iVar3;
    }
    if (iVar4 == 1) {
      bVar11 = true;
      pTVar6 = t1;
      iVar4 = t1_current_subtree;
LAB_00107c67:
      dVar13 = spfR(this,t2,t2_current_subtree,pTVar6,iVar4,bVar11);
      return dVar13;
    }
    if (iVar4 != 0) {
      iVar7 = iVar2 + ~uVar9;
      bVar11 = true;
      pTVar6 = t1;
      iVar10 = t1_current_subtree;
LAB_00107cb0:
      dVar13 = spfA(this,t2,t2_current_subtree,pTVar6,iVar10,iVar7,iVar4,bVar11);
      return dVar13;
    }
    bVar11 = true;
    pTVar6 = t1;
    iVar4 = t1_current_subtree;
  }
  else {
    if (iVar3 < 0) {
      iVar4 = 0;
    }
    else {
      uVar8 = 0;
      if ((int)uVar9 < iVar3) {
        uVar8 = uVar9;
      }
      iVar4 = ((uVar8 - iVar3) + iVar4 + t1_current_subtree != 0) + 1;
    }
    iVar10 = iVar7;
    for (iVar2 = (t1->super_PreLToParent).prel_to_parent_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[iVar7]; t1_current_subtree <= iVar2;
        iVar2 = (t1->super_PreLToParent).prel_to_parent_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar2]) {
      pvVar1 = (t1->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&pvVar1[iVar2].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) -
                            *(long *)&pvVar1[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl) >> 2);
      if (0 < (int)uVar9) {
        uVar12 = 0;
        do {
          iVar3 = *(int *)(*(long *)&pvVar1[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + uVar12 * 4);
          if (iVar3 != iVar10) {
            gted(this,t1,iVar3,t2,t2_current_subtree);
          }
          uVar12 = uVar12 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar12);
      }
      iVar10 = iVar2;
    }
    if (iVar4 == 1) {
      bVar11 = false;
      pTVar6 = t2;
      t2 = t1;
      iVar4 = t2_current_subtree;
      t2_current_subtree = t1_current_subtree;
      goto LAB_00107c67;
    }
    if (iVar4 != 0) {
      bVar11 = false;
      pTVar6 = t2;
      t2 = t1;
      iVar10 = t2_current_subtree;
      t2_current_subtree = t1_current_subtree;
      goto LAB_00107cb0;
    }
    bVar11 = false;
    pTVar6 = t2;
    t2 = t1;
    iVar4 = t2_current_subtree;
    t2_current_subtree = t1_current_subtree;
  }
  dVar13 = spfL(this,t2,t2_current_subtree,pTVar6,iVar4,bVar11);
  return dVar13;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::gted(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree) {
  const int currentSubtree1 = t1_current_subtree;
  const int currentSubtree2 = t2_current_subtree;
  const int subtreeSize1 = t1.prel_to_size_[currentSubtree1];
  const int subtreeSize2 = t2.prel_to_size_[currentSubtree2];

  // std::cout << "gted(" << currentSubtree1 << "," << currentSubtree2 << ")" << std::endl;

  double result = 0;

  // Use spf1.
  if ((subtreeSize1 == 1 || subtreeSize2 == 1)) {
    result = spf1(t1, currentSubtree1, t2, currentSubtree2);
    // std::cerr << "spf1(" << currentSubtree1 << "," << currentSubtree2 << ") = " << result << std::endl;
    return result;
  }

  int strategyPathID = static_cast<int>(delta_.read_at(currentSubtree1, currentSubtree2));

  int strategyPathType = -1;
  int currentPathNode = std::abs(strategyPathID) - 1;
  int pathIDOffset = t1.tree_size_;

  int parent = -1;
  if(currentPathNode < pathIDOffset) {
    strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree1, subtreeSize1);
    parent = t1.prel_to_parent_[currentPathNode];
    while(parent >= currentSubtree1) {
      auto& ai = t1.prel_to_children_[parent];
      int k = ai.size();
      for(int i = 0; i < k; ++i) {
        int child = ai[i];
        if(child != currentPathNode) {
          // t1.set_current_node(child);
          gted(t1, child, t2, t2_current_subtree);
        }
      }
      currentPathNode = parent;
      parent = t1.prel_to_parent_[currentPathNode];
    }
    // TODO: Move this property away from node indexer and pass directly to spfs.
    // t1.set_current_node(currentSubtree1);

    // Pass to spfs a boolean that says says if the order of input subtrees
    // has been swapped compared to the order of the initial input trees.
    // Used for accessing delta array and deciding on the edit operation
    // [1, Section 3.4].
    if (strategyPathType == 0) {
      result = spfL(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    if (strategyPathType == 1) {
      result = spfR(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    result = spfA(t1, t1_current_subtree, t2, t2_current_subtree,
        std::abs(strategyPathID) - 1, strategyPathType, false);
    // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }

  currentPathNode -= pathIDOffset;
  strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree2, subtreeSize2);
  parent = t2.prel_to_parent_[currentPathNode];
  while(parent >= currentSubtree2) {
    // std::cerr << "parent = " << parent << std::endl;
    // std::cerr << "# parent's children = " << t2.prel_to_children_[parent].size() << std::endl;
    auto& ai1 = t2.prel_to_children_[parent];
    int l = ai1.size();
    for(int j = 0; j < l; ++j) {
      int child = ai1[j];
      if(child != currentPathNode) {
        // t2.set_current_node(child);
        gted(t1, t1_current_subtree, t2, child);
      }
    }
    currentPathNode = parent;
    parent = t2.prel_to_parent_[currentPathNode];
  }
  // TODO: Move this property away from node indexer and pass directly to spfs.
  // t2.set_current_node(currentSubtree2);

  // Pass to spfs a boolean that says says if the order of input subtrees
  // has been swapped compared to the order of the initial input trees. Used
  // for accessing delta array and deciding on the edit operation
  // [1, Section 3.4].
  if (strategyPathType == 0) {
    result = spfL(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  if (strategyPathType == 1) {
    result = spfR(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  result = spfA(t2, t2_current_subtree, t1, t1_current_subtree,
      std::abs(strategyPathID) - pathIDOffset - 1, strategyPathType, true);
  // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
  return result;
}